

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_constrain(REF_GRID_conflict ref_grid,REF_INT node)

{
  int iVar1;
  REF_GEOM ref_geom;
  REF_ADJ pRVar2;
  REF_NODE pRVar3;
  REF_DBL *pRVar4;
  uint uVar5;
  long lVar6;
  REF_INT *pRVar7;
  undefined8 uVar8;
  ulong uVar9;
  char *pcVar10;
  int iVar11;
  bool bVar12;
  REF_DBL xyz [3];
  REF_DBL local_48;
  REF_DBL local_40;
  REF_DBL local_38;
  
  if (node < 0) {
    return 0;
  }
  ref_geom = ref_grid->geom;
  pRVar2 = ref_geom->ref_adj;
  if (pRVar2->nnode <= node) {
    return 0;
  }
  uVar5 = pRVar2->first[(uint)node];
  lVar6 = (long)(int)uVar5;
  if (lVar6 == -1) {
    return 0;
  }
  if (ref_geom->meshlink != (void *)0x0) {
    uVar5 = ref_meshlink_constrain(ref_grid,node);
    if (uVar5 == 0) {
      return 0;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x614,
           "ref_geom_constrain",(ulong)uVar5,"meshlink");
    return uVar5;
  }
  iVar11 = pRVar2->item[lVar6].ref;
  if (ref_geom->descr[(long)iVar11 * 6] == 0) {
    bVar12 = false;
  }
  else {
    uVar9 = (ulong)uVar5;
    do {
      iVar1 = pRVar2->item[(int)uVar9].next;
      uVar9 = (ulong)iVar1;
      iVar11 = -1;
      if (uVar9 != 0xffffffffffffffff) {
        iVar11 = pRVar2->item[uVar9].ref;
      }
      bVar12 = iVar1 == -1;
      if (bVar12) {
        iVar11 = -1;
        break;
      }
    } while (ref_geom->descr[iVar11 * 6] != 0);
  }
  pRVar3 = ref_grid->node;
  if (bVar12) {
    iVar11 = pRVar2->item[lVar6].ref;
    if (ref_geom->descr[(long)iVar11 * 6] == 1) {
      bVar12 = false;
    }
    else {
      uVar9 = (ulong)uVar5;
      do {
        iVar1 = pRVar2->item[(int)uVar9].next;
        uVar9 = (ulong)iVar1;
        iVar11 = -1;
        if (uVar9 != 0xffffffffffffffff) {
          iVar11 = pRVar2->item[uVar9].ref;
        }
        bVar12 = iVar1 == -1;
        if (bVar12) {
          iVar11 = -1;
          break;
        }
      } while (ref_geom->descr[iVar11 * 6] != 1);
    }
    if (bVar12) {
      iVar11 = pRVar2->item[lVar6].ref;
      if (ref_geom->descr[(long)iVar11 * 6] == 2) {
        bVar12 = false;
      }
      else {
        do {
          iVar1 = pRVar2->item[(int)lVar6].next;
          lVar6 = (long)iVar1;
          iVar11 = -1;
          if (lVar6 != -1) {
            iVar11 = pRVar2->item[lVar6].ref;
          }
          bVar12 = iVar1 == -1;
          if (bVar12) {
            iVar11 = -1;
            break;
          }
        } while (ref_geom->descr[iVar11 * 6] != 2);
      }
      if (bVar12) {
        return 0;
      }
      uVar5 = ref_egads_eval(ref_geom,iVar11,&local_48,(REF_DBL *)0x0);
      if (uVar5 == 0) {
        pRVar7 = ref_geom->descr;
        goto LAB_00139720;
      }
      pcVar10 = "eval face";
      uVar8 = 0x64d;
    }
    else {
      uVar5 = ref_egads_eval(ref_geom,iVar11,&local_48,(REF_DBL *)0x0);
      if (uVar5 == 0) {
        lVar6 = (long)ref_geom->descr[(long)(iVar11 * 6) + 5];
        pRVar4 = pRVar3->real;
        pRVar4[lVar6 * 0xf] = local_48;
        pRVar4[lVar6 * 0xf + 1] = local_40;
        pRVar4[lVar6 * 0xf + 2] = local_38;
        uVar5 = ref_geom_eval_edge_face_uv(ref_grid,iVar11);
        if (uVar5 == 0) {
          return 0;
        }
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x63c,"ref_geom_constrain",(ulong)uVar5,"resol edge uv");
        return uVar5;
      }
      pcVar10 = "eval edge";
      uVar8 = 0x637;
    }
  }
  else {
    uVar5 = ref_egads_eval(ref_geom,iVar11,&local_48,(REF_DBL *)0x0);
    if (uVar5 == 0) {
      pRVar7 = ref_geom->descr;
LAB_00139720:
      lVar6 = (long)pRVar7[(long)(iVar11 * 6) + 5];
      pRVar4 = pRVar3->real;
      pRVar4[lVar6 * 0xf] = local_48;
      pRVar4[lVar6 * 0xf + 1] = local_40;
      pRVar4[lVar6 * 0xf + 2] = local_38;
      return 0;
    }
    pcVar10 = "eval edge";
    uVar8 = 0x623;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar8,
         "ref_geom_constrain",(ulong)uVar5,pcVar10);
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_geom_constrain(REF_GRID ref_grid, REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_ADJ ref_adj = ref_geom_adj(ref_geom);
  REF_INT item, geom;
  REF_BOOL have_geom_node;
  REF_BOOL have_geom_edge;
  REF_BOOL have_geom_face;
  REF_INT node_geom;
  REF_INT edge_geom;
  REF_INT face_geom;
  REF_DBL xyz[3];

  /* no geom, do nothing */
  if (ref_adj_empty(ref_adj, node)) return REF_SUCCESS;

  if (ref_geom_meshlinked(ref_geom)) {
    RSS(ref_meshlink_constrain(ref_grid, node), "meshlink");
    return REF_SUCCESS;
  }

  have_geom_node = REF_FALSE;
  node_geom = REF_EMPTY;
  each_ref_adj_node_item_with_ref(ref_adj, node, item, geom) {
    if (REF_GEOM_NODE == ref_geom_type(ref_geom, geom)) {
      have_geom_node = REF_TRUE;
      node_geom = geom;
      break;
    }
  }

  if (have_geom_node) { /* update T of edges? update UV of (degen) faces? */
    RSS(ref_egads_eval(ref_geom, node_geom, xyz, NULL), "eval edge");
    node = ref_geom_node(ref_geom, node_geom);
    ref_node_xyz(ref_node, 0, node) = xyz[0];
    ref_node_xyz(ref_node, 1, node) = xyz[1];
    ref_node_xyz(ref_node, 2, node) = xyz[2];
    return REF_SUCCESS;
  }

  have_geom_edge = REF_FALSE;
  edge_geom = REF_EMPTY;
  each_ref_adj_node_item_with_ref(ref_adj, node, item, geom) {
    if (REF_GEOM_EDGE == ref_geom_type(ref_geom, geom)) {
      have_geom_edge = REF_TRUE;
      edge_geom = geom;
      break;
    }
  }

  /* edge geom, evaluate edge and update face uv */
  if (have_geom_edge) {
    RSS(ref_egads_eval(ref_geom, edge_geom, xyz, NULL), "eval edge");
    node = ref_geom_node(ref_geom, edge_geom);
    ref_node_xyz(ref_node, 0, node) = xyz[0];
    ref_node_xyz(ref_node, 1, node) = xyz[1];
    ref_node_xyz(ref_node, 2, node) = xyz[2];
    RSS(ref_geom_eval_edge_face_uv(ref_grid, edge_geom), "resol edge uv");
    return REF_SUCCESS;
  }

  /* look for face geom */
  have_geom_face = REF_FALSE;
  face_geom = REF_EMPTY;
  each_ref_adj_node_item_with_ref(ref_adj, node, item, geom) {
    if (REF_GEOM_FACE == ref_geom_type(ref_geom, geom)) {
      have_geom_face = REF_TRUE;
      face_geom = geom;
      break;
    }
  }

  /* face geom, evaluate on face uv */
  if (have_geom_face) {
    RSS(ref_egads_eval(ref_geom, face_geom, xyz, NULL), "eval face");
    node = ref_geom_node(ref_geom, face_geom);
    ref_node_xyz(ref_node, 0, node) = xyz[0];
    ref_node_xyz(ref_node, 1, node) = xyz[1];
    ref_node_xyz(ref_node, 2, node) = xyz[2];
    return REF_SUCCESS;
  }

  return REF_SUCCESS;
}